

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDErrorReporter.cpp
# Opt level: O1

void xercesc_4_0::XMLInitializer::initializeXSDErrorReporter(void)

{
  gErrMsgLoader = XMLPlatformUtils::loadMsgSet(L"http://apache.org/xml/messages/XMLErrors");
  if (gErrMsgLoader == (XMLMsgLoader *)0x0) {
    XMLPlatformUtils::panic(Panic_CantLoadMsgDomain);
  }
  gValidMsgLoader = XMLPlatformUtils::loadMsgSet(L"http://apache.org/xml/messages/XMLValidity");
  if (gValidMsgLoader != (XMLMsgLoader *)0x0) {
    return;
  }
  XMLPlatformUtils::panic(Panic_CantLoadMsgDomain);
  return;
}

Assistant:

void XMLInitializer::initializeXSDErrorReporter()
{
    gErrMsgLoader = XMLPlatformUtils::loadMsgSet(XMLUni::fgXMLErrDomain);

    if (!gErrMsgLoader)
      XMLPlatformUtils::panic(PanicHandler::Panic_CantLoadMsgDomain);

    gValidMsgLoader = XMLPlatformUtils::loadMsgSet(XMLUni::fgValidityDomain);

    if (!gValidMsgLoader)
      XMLPlatformUtils::panic(PanicHandler::Panic_CantLoadMsgDomain);
}